

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llist.c
# Opt level: O2

void Curl_llist_remove(curl_llist *list,curl_llist_element *e,void *user)

{
  size_t sVar1;
  void *pvVar2;
  curl_llist *pcVar3;
  curl_llist_element *pcVar4;
  curl_llist *pcVar5;
  
  if ((e != (curl_llist_element *)0x0) && (sVar1 = list->size, sVar1 != 0)) {
    if (list->head == e) {
      pcVar3 = (curl_llist *)e->next;
      list->head = (curl_llist_element *)pcVar3;
      pcVar4 = (curl_llist_element *)0x0;
    }
    else {
      pcVar4 = e->prev;
      pcVar3 = (curl_llist *)e->next;
      pcVar5 = (curl_llist *)&pcVar4->next;
      if (pcVar4 == (curl_llist_element *)0x0) {
        pcVar5 = list;
      }
      pcVar5->head = (curl_llist_element *)pcVar3;
    }
    if (pcVar3 == (curl_llist *)0x0) {
      pcVar3 = list;
    }
    pcVar3->tail = pcVar4;
    pvVar2 = e->ptr;
    e->next = (curl_llist_element *)0x0;
    e->ptr = (void *)0x0;
    e->prev = (curl_llist_element *)0x0;
    list->size = sVar1 - 1;
    if (list->dtor != (curl_llist_dtor)0x0) {
      (*list->dtor)(user,pvVar2);
      return;
    }
  }
  return;
}

Assistant:

void
Curl_llist_remove(struct curl_llist *list, struct curl_llist_element *e,
                  void *user)
{
  void *ptr;
  if(e == NULL || list->size == 0)
    return;

  if(e == list->head) {
    list->head = e->next;

    if(list->head == NULL)
      list->tail = NULL;
    else
      e->next->prev = NULL;
  }
  else {
    if(!e->prev)
      list->head = e->next;
    else
      e->prev->next = e->next;

    if(!e->next)
      list->tail = e->prev;
    else
      e->next->prev = e->prev;
  }

  ptr = e->ptr;

  e->ptr  = NULL;
  e->prev = NULL;
  e->next = NULL;

  --list->size;

  /* call the dtor() last for when it actually frees the 'e' memory itself */
  if(list->dtor)
    list->dtor(user, ptr);
}